

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O2

int Gia_PolynHandleOne(Hsh_VecMan_t *pHashC,Hsh_VecMan_t *pHashM,Vec_Int_t *vCoefs,
                      Vec_Wec_t *vLit2Mono,Vec_Int_t *vTempC,Vec_Int_t *vTempM,int iMono,int iLitOld
                      ,int iLitNew0,int iLitNew1)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vVec2;
  Vec_Int_t *vVec2_00;
  long lVar4;
  ulong uVar5;
  
  iVar2 = Vec_IntEntry(vCoefs,iMono);
  vVec2 = Hsh_VecReadEntry(pHashC,iVar2);
  vVec2_00 = Hsh_VecReadEntry(pHashM,iMono);
  vTempM->nSize = 0;
  Vec_IntAppend(vTempM,vVec2_00);
  uVar3 = vTempM->nSize;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  lVar4 = 1;
  while( true ) {
    if (lVar4 - uVar5 == 1) {
      if ((int)uVar3 < 0) {
        __assert_fail("i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
      }
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                    ,0x1ed,
                    "int Gia_PolynHandleOne(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                   );
    }
    piVar1 = vTempM->pArray;
    if (piVar1[lVar4 + -1] == iLitOld) break;
    lVar4 = lVar4 + 1;
  }
  for (; (int)lVar4 < (int)uVar3; lVar4 = lVar4 + 1) {
    piVar1[lVar4 + -1] = piVar1[lVar4];
    uVar3 = vTempM->nSize;
  }
  vTempM->nSize = uVar3 - 1;
  if ((iLitNew1 & iLitNew0) == 0xffffffff) {
    Vec_IntAppendMinusAbs(vTempC,vVec2,0);
  }
  else {
    if (iLitNew0 < 0 || iLitNew1 != -1) {
      if ((iLitNew1 | iLitNew0) < 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPo.c"
                      ,0x1fc,
                      "int Gia_PolynHandleOne(Hsh_VecMan_t *, Hsh_VecMan_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                     );
      }
      Vec_IntAppendMinusAbs(vTempC,vVec2,0);
      Vec_IntPushUniqueOrder(vTempM,iLitNew0);
      iLitNew0 = iLitNew1;
    }
    else {
      Vec_IntAppendMinusAbs(vTempC,vVec2,1);
    }
    Vec_IntPushUniqueOrder(vTempM,iLitNew0);
  }
  iVar2 = Gia_PolynBuildAdd(pHashC,pHashM,vCoefs,vLit2Mono,vTempC,vTempM);
  return iVar2;
}

Assistant:

static inline int Gia_PolynHandleOne( Hsh_VecMan_t * pHashC, Hsh_VecMan_t * pHashM, Vec_Int_t * vCoefs, 
                                      Vec_Wec_t * vLit2Mono, Vec_Int_t * vTempC, Vec_Int_t * vTempM, 
                                      int iMono, int iLitOld, int iLitNew0, int iLitNew1 )
{
    int status, iConst = Vec_IntEntry( vCoefs, iMono );
    Vec_Int_t * vArrayC = Hsh_VecReadEntry( pHashC, iConst );
    Vec_Int_t * vArrayM = Hsh_VecReadEntry( pHashM, iMono );
    // create new monomial
    Vec_IntClear( vTempM );
    Vec_IntAppend( vTempM, vArrayM );
    status = Vec_IntRemove( vTempM, iLitOld );
    assert( status );
    // create new monomial
    if ( iLitNew0 == -1 && iLitNew1 == -1 )     // no new lit - the same const
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 0 );
    else if ( iLitNew0 > -1 && iLitNew1 == -1 ) // one new lit - opposite const
    {
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 1 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew0 );
    }
    else if ( iLitNew0 > -1 && iLitNew1 > -1 )  // both new lit - the same const
    {
        Vec_IntAppendMinusAbs( vTempC, vArrayC, 0 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew0 );
        Vec_IntPushUniqueOrder( vTempM, iLitNew1 );
    }
    else assert( 0 );
    return Gia_PolynBuildAdd( pHashC, pHashM, vCoefs, vLit2Mono, vTempC, vTempM );
}